

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

void Cloud_Quit(CloudManager *dd)

{
  long lVar1;
  
  if (dd->ppNodes != (CloudNode **)0x0) {
    free(dd->ppNodes);
    dd->ppNodes = (CloudNode **)0x0;
  }
  if (dd->tUnique != (CloudNode *)0x0) {
    free(dd->tUnique);
    dd->tUnique = (CloudNode *)0x0;
  }
  if (dd->vars != (CloudNode **)0x0) {
    free(dd->vars);
    dd->vars = (CloudNode **)0x0;
  }
  for (lVar1 = 0x12; lVar1 != 0x16; lVar1 = lVar1 + 1) {
    if (*(void **)(dd->bitsCache + lVar1 * 2 + -2) != (void *)0x0) {
      free(*(void **)(dd->bitsCache + lVar1 * 2 + -2));
      (dd->bitsCache + lVar1 * 2 + -2)[0] = 0;
      (dd->bitsCache + lVar1 * 2 + -2)[1] = 0;
    }
  }
  free(dd);
  return;
}

Assistant:

void Cloud_Quit( CloudManager * dd )
{
    int i;
    ABC_FREE( dd->ppNodes );
    ABC_FREE( dd->tUnique ); 
    ABC_FREE( dd->vars ); 
    for ( i = 0; i < 4; i++ )
        ABC_FREE( dd->tCaches[i] );
    ABC_FREE( dd ); 
}